

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x2x.cc
# Opt level: O2

bool __thiscall
anon_unknown.dwarf_2019::DataTransform<unsigned_long,_unsigned_char>::Run
          (DataTransform<unsigned_long,_unsigned_char> *this,istream *input_stream)

{
  byte bVar1;
  NumericType NVar2;
  WarningType WVar3;
  bool bVar4;
  bool bVar5;
  ostream *poVar6;
  size_t *__idx;
  byte data_to_write;
  int iVar7;
  longdouble in_ST0;
  longdouble lVar8;
  longdouble lVar9;
  longdouble in_ST1;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble in_ST5;
  double dVar10;
  undefined1 auVar11 [16];
  allocator local_271;
  unsigned_long input_data;
  string *local_268;
  unsigned_long local_260;
  ulong local_258;
  string local_250;
  string word;
  char buffer [128];
  
  local_268 = &this->print_format_;
  iVar7 = 0;
  do {
    if (this->is_ascii_input_ == true) {
      word._M_dataplus._M_p = (pointer)&word.field_2;
      word._M_string_length = 0;
      word.field_2._M_local_buf[0] = '\0';
      std::operator>>(input_stream,(string *)&word);
      if (word._M_string_length == 0) {
        bVar5 = false;
        bVar4 = true;
      }
      else {
        std::__cxx11::stold((longdouble *)&word,(string *)0x0,__idx);
        lVar8 = (longdouble)9.223372e+18;
        lVar9 = (longdouble)0;
        if (lVar8 <= in_ST0) {
          lVar9 = lVar8;
        }
        local_258 = (ulong)ROUND(in_ST0 - lVar9);
        input_data = (ulong)(lVar8 <= in_ST0) << 0x3f ^ local_258;
        bVar4 = false;
        bVar5 = true;
        in_ST0 = in_ST1;
        in_ST1 = in_ST2;
        in_ST2 = in_ST3;
        in_ST3 = in_ST4;
        in_ST4 = in_ST5;
      }
      std::__cxx11::string::~string((string *)&word);
      if (bVar5) goto LAB_0012cd7a;
      if (bVar4) {
        if (bVar4) {
LAB_0012cf95:
          bVar5 = true;
          if ((this->is_ascii_output_ == true) && (iVar7 % this->num_column_ != 0)) {
            std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
          }
        }
        else {
LAB_0012cfb7:
          bVar5 = false;
        }
        return bVar5;
      }
    }
    else {
      bVar5 = sptk::ReadStream<unsigned_long>(&input_data,input_stream);
      if (!bVar5) goto LAB_0012cf95;
LAB_0012cd7a:
      data_to_write = this->minimum_value_;
      bVar1 = this->maximum_value_;
      if (data_to_write < bVar1) {
        NVar2 = this->input_numeric_type_;
        if (NVar2 == kFloatingPoint) {
          local_260 = input_data;
          if (((float)data_to_write <=
               (float)(long)input_data +
               *(float *)(&DAT_00140b30 + (ulong)((long)input_data < 0) * 4)) &&
             (data_to_write = bVar1,
             (float)(long)input_data + *(float *)(&DAT_00140b30 + (ulong)((long)input_data < 0) * 4)
             <= (float)bVar1)) goto LAB_0012ce26;
        }
        else if (NVar2 == kUnsignedInteger) {
          if (data_to_write <= input_data) {
LAB_0012cdd4:
            bVar5 = bVar1 < input_data;
            data_to_write = (byte)input_data;
            if (bVar1 < input_data) {
              data_to_write = bVar1;
            }
            goto LAB_0012ce2b;
          }
        }
        else {
          if (NVar2 != kSignedInteger) goto LAB_0012ce26;
          if ((long)(ulong)data_to_write <= (long)input_data) goto LAB_0012cdd4;
        }
LAB_0012ce6b:
        if (this->warning_type_ != kIgnore) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&word);
          poVar6 = (ostream *)std::ostream::operator<<((ostream *)&word,iVar7);
          std::operator<<(poVar6,"th data is over the range of output type");
          std::__cxx11::string::string((string *)&local_250,"x2x",&local_271);
          sptk::PrintErrorMessage(&local_250,(ostringstream *)&word);
          std::__cxx11::string::~string((string *)&local_250);
          WVar3 = this->warning_type_;
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&word);
          if (WVar3 == kExit) goto LAB_0012cfb7;
        }
      }
      else {
LAB_0012ce26:
        bVar5 = false;
        data_to_write = (byte)input_data;
LAB_0012ce2b:
        if ((bVar5) || (this->rounding_ == false)) {
          if (bVar5) goto LAB_0012ce6b;
        }
        else {
          auVar11._8_4_ = (int)(input_data >> 0x20);
          auVar11._0_8_ = input_data;
          auVar11._12_4_ = 0x45300000;
          dVar10 = (auVar11._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)input_data) - 4503599627370496.0);
          if (input_data == 0) {
            dVar10 = dVar10 + -0.5;
          }
          else {
            dVar10 = dVar10 + 0.5;
          }
          data_to_write = (byte)(int)dVar10;
        }
      }
      if (this->is_ascii_output_ == true) {
        bVar5 = sptk::SnPrintf<unsigned_char>(data_to_write,local_268,0x80,buffer);
        if (!bVar5) goto LAB_0012cfb7;
        std::operator<<((ostream *)&std::cout,buffer);
        if ((iVar7 + 1) % this->num_column_ == 0) {
          std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
        }
        else {
          std::operator<<((ostream *)&std::cout,"\t");
        }
      }
      else {
        bVar5 = sptk::WriteStream<unsigned_char>(data_to_write,(ostream *)&std::cout);
        if (!bVar5) goto LAB_0012cfb7;
      }
    }
    iVar7 = iVar7 + 1;
  } while( true );
}

Assistant:

bool Run(std::istream* input_stream) const override {
    char buffer[kBufferSize];
    int index(0);
    for (;; ++index) {
      // Read.
      T1 input_data;
      if (is_ascii_input_) {
        std::string word;
        *input_stream >> word;
        if (word.empty()) break;
        try {
          input_data = static_cast<T1>(std::stold(word));
        } catch (std::invalid_argument&) {
          return false;
        }
      } else {
        if (!sptk::ReadStream(&input_data, input_stream)) {
          break;
        }
      }

      // Convert.
      T2 output_data(static_cast<T2>(input_data));

      bool is_clipped(false);
      {
        // Clipping.
        if (minimum_value_ < maximum_value_) {
          if (kSignedInteger == input_numeric_type_) {
            if (static_cast<std::int64_t>(input_data) <
                static_cast<std::int64_t>(minimum_value_)) {
              output_data = minimum_value_;
              is_clipped = true;
            } else if (static_cast<std::int64_t>(maximum_value_) <
                       static_cast<std::int64_t>(input_data)) {
              output_data = maximum_value_;
              is_clipped = true;
            }
          } else if (kUnsignedInteger == input_numeric_type_) {
            if (static_cast<std::uint64_t>(input_data) <
                static_cast<std::uint64_t>(minimum_value_)) {
              output_data = minimum_value_;
              is_clipped = true;
            } else if (static_cast<std::uint64_t>(maximum_value_) <
                       static_cast<std::uint64_t>(input_data)) {
              output_data = maximum_value_;
              is_clipped = true;
            }
          } else if (kFloatingPoint == input_numeric_type_) {
            if (static_cast<long double>(input_data) <
                static_cast<long double>(minimum_value_)) {
              output_data = minimum_value_;
              is_clipped = true;
            } else if (static_cast<long double>(maximum_value_) <
                       static_cast<long double>(input_data)) {
              output_data = maximum_value_;
              is_clipped = true;
            }
          }
        }

        // Rounding.
        if (rounding_ && !is_clipped) {
          if (0.0 < input_data) {
            output_data = static_cast<T2>(input_data + 0.5);
          } else {
            output_data = static_cast<T2>(input_data - 0.5);
          }
        }
      }

      if (is_clipped && kIgnore != warning_type_) {
        std::ostringstream error_message;
        error_message << index << "th data is over the range of output type";
        sptk::PrintErrorMessage("x2x", error_message);
        if (kExit == warning_type_) return false;
      }

      // Write output.
      if (is_ascii_output_) {
        if (!sptk::SnPrintf(output_data, print_format_, sizeof(buffer),
                            buffer)) {
          return false;
        }
        std::cout << buffer;
        if (0 == (index + 1) % num_column_) {
          std::cout << std::endl;
        } else {
          std::cout << "\t";
        }
      } else {
        if (!sptk::WriteStream(output_data, &std::cout)) {
          return false;
        }
      }
    }

    if (is_ascii_output_ && 0 != index % num_column_) {
      std::cout << std::endl;
    }

    return true;
  }